

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O0

string * format_error<char_const*&>
                   (string *__return_storage_ptr__,Options *options,char *type,
                   optional<const_TokenStream::TextStream_&> *stream,char *filename,uint32_t lineno,
                   uint32_t colno,uint32_t length,char *msg,char **args)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  unreachable_exception *this;
  optional<const_TokenStream::TextStream_&> *poVar4;
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  allocator<char> local_21a;
  byte local_219;
  string local_218;
  string_view local_1f8;
  string local_1e8;
  BasicCStringRef<char> local_1c8;
  string local_1c0;
  string_view local_1a0;
  string local_190;
  byte local_16a;
  allocator<char> local_169;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  string local_158;
  byte local_132;
  allocator<char> local_131;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  string local_120;
  BasicCStringRef<char> local_100;
  string local_f8;
  BasicCStringRef<char> local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_59;
  optional<const_TokenStream::TextStream_&> *local_58;
  anon_class_32_4_eb191f4b make_helper;
  uint32_t lineno_local;
  char *filename_local;
  optional<const_TokenStream::TextStream_&> *stream_local;
  char *type_local;
  Options *options_local;
  string *message;
  
  make_helper.stream = (optional<const_TokenStream::TextStream_&> *)((long)&make_helper.length + 4);
  make_helper.lineno = &colno;
  make_helper.colno = &length;
  local_58 = stream;
  make_helper.length._4_4_ = lineno;
  if (options->error_format == Default) {
    local_59 = 0;
    poVar4 = stream;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar5 = (char)__return_storage_ptr__;
    if (filename == (char *)0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"gta3sc:");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,filename);
      std::__cxx11::string::push_back(cVar5);
    }
    if (make_helper.length._4_4_ != 0) {
      std::__cxx11::to_string(&local_90,make_helper.length._4_4_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::push_back(cVar5);
    }
    if ((make_helper.length._4_4_ != 0) && (colno != 0)) {
      std::__cxx11::to_string(&local_b0,colno);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::push_back(cVar5);
    }
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      std::__cxx11::string::push_back(cVar5);
    }
    if (type != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,type);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
    }
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_d8,msg);
    fmt::format<char_const*>(&local_d0,(fmt *)local_d8.data_,(CStringRef)args,(char **)poVar4);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    bVar1 = std::experimental::optional::operator_cast_to_bool((optional *)stream);
    if ((bVar1) && (make_helper.length._4_4_ != 0)) {
      std::__cxx11::string::push_back(cVar5);
      format_error<char_const*&>(Options_const&,char_const*,std::experimental::optional<TokenStream::TextStream_const&>,char_const*,unsigned_int,unsigned_int,unsigned_int,char_const*,char_const*&)
      ::{lambda()#1}::operator()[abi_cxx11_(&local_f8,&local_58);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
  }
  else {
    if (options->error_format != JSON) {
      this = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/program.hpp(418)."
                );
      __cxa_throw(this,&unreachable_exception::typeinfo,
                  unreachable_exception::~unreachable_exception);
    }
    poVar4 = stream;
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_100,
               "{{\"file\": {}, \"type\": {}, \"line\": {}, \"column\": {}, \"length\": {}, \"message\": {}, \"helper\": {}}}"
              );
    local_132 = 0;
    if (filename == (char *)0x0) {
      std::allocator<char>::allocator();
      local_132 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"null",&local_131);
    }
    else {
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_130,filename);
      make_quoted_abi_cxx11_(&local_120,&local_130,'\"');
    }
    local_16a = 0;
    if (type == (char *)0x0) {
      std::allocator<char>::allocator();
      local_16a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"null",&local_169);
    }
    else {
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_168,type);
      make_quoted_abi_cxx11_(&local_158,&local_168,'\"');
    }
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_1c8,msg);
    fmt::format<char_const*>(&local_1c0,(fmt *)local_1c8.data_,(CStringRef)args,(char **)poVar4);
    libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>
              ((basic_string_view<char,std::char_traits<char>> *)&local_1a0,&local_1c0);
    make_quoted_abi_cxx11_(&local_190,&local_1a0,'\"');
    bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)stream);
    local_219 = 0;
    bVar1 = false;
    if ((bVar2) && (make_helper.length._4_4_ != 0)) {
      format_error<char_const*&>(Options_const&,char_const*,std::experimental::optional<TokenStream::TextStream_const&>,char_const*,unsigned_int,unsigned_int,unsigned_int,char_const*,char_const*&)
      ::{lambda()#1}::operator()[abi_cxx11_(&local_218,&local_58);
      local_219 = 1;
      libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_1f8,&local_218);
      make_quoted_abi_cxx11_(&local_1e8,&local_1f8,'\"');
    }
    else {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"null",&local_21a);
    }
    fmt::
    format<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(fmt *)local_100.data_,(CStringRef)&local_120,&local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&make_helper.length + 4),&colno,&length,(uint *)&local_190,&local_1e8,
               in_stack_fffffffffffffd90);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (bVar1) {
      std::allocator<char>::~allocator(&local_21a);
    }
    if ((local_219 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_218);
    }
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_158);
    if ((local_16a & 1) != 0) {
      std::allocator<char>::~allocator(&local_169);
    }
    std::__cxx11::string::~string((string *)&local_120);
    if ((local_132 & 1) != 0) {
      std::allocator<char>::~allocator(&local_131);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& options,
                                const char* type,
                                optional<const TokenStream::TextStream&> stream,
                                const char* filename, uint32_t lineno, uint32_t colno, uint32_t length,
                                const char* msg, Args&&... args)
{
    auto make_helper = [&]() -> std::string
    {
        Expects(stream && lineno && colno);

        std::string arrow_line;
        std::string line = stream->get_line(lineno);
        arrow_line.reserve(colno + length);

        for(size_t i = 0; i < colno; ++i)
            arrow_line.push_back(line[i] != '\t'? ' ' : '\t');
        arrow_line.back() = '^';

        for(size_t i = 1; i < length; ++i)
            arrow_line.push_back('~');

        return fmt::format(" {}\n {}", line, arrow_line);
    };

    if(options.error_format == Options::ErrorFormat::Default)
    {
        std::string message;
        message.reserve(255);

        if(filename)
        {
            message += filename;
            message.push_back(':');
        }
        else
        {
            message += "gta3sc:";
        }

        if(lineno)
        {
            message += std::to_string(lineno);
            message.push_back(':');
        }

        if(lineno && colno)
        {
            message += std::to_string(colno);
            message.push_back(':');
        }

        if(message.size())
        {
            message.push_back(' ');
        }

        if(type)
        {
            message += type;
            message += ": ";
        }

        message += fmt::format(msg, std::forward<Args>(args)...);

        if(stream && lineno)
        {
            message.push_back('\n');
            message += make_helper();
        }

        return message;
    }
    else if(options.error_format == Options::ErrorFormat::JSON)
    {
        /*
            This is the JSON object to be printed (in a single line!):
            {
                "file": string | null,
                "type": string | null, // "error", "warning", "note" or "fatal error"
                "line": integer,        // 0 means no line information
                "column": integer,      // 0 means no column information
                "length": integer,      // 0 means no length information
                "message": string,
                "helper": string | null,
            }
        */
        return fmt::format(R"({{"file": {}, "type": {}, "line": {}, "column": {}, "length": {}, "message": {}, "helper": {}}})",
                            filename? make_quoted(filename) : "null",
                            type? make_quoted(type) : "null",
                            lineno, colno, length,  // line, column, length
                            make_quoted(fmt::format(msg, std::forward<Args>(args)...)),
                            stream && lineno? make_quoted(make_helper()) : "null");

    }
    else
    {
        Unreachable();
    }
}